

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O1

bool __thiscall
cfd::TransactionController::VerifyInputSignature
          (TransactionController *this,ByteData *signature,Pubkey *pubkey,Txid *txid,uint32_t vout,
          Script *script,SigHashType sighash_type,Amount *value,WitnessVersion version)

{
  bool bVar1;
  undefined4 in_stack_00000014;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  ByteData256 local_70;
  ByteData sighash;
  SigHashType local_3c;
  
  core::SigHashType::SigHashType(&local_3c,(SigHashType *)sighash_type._0_8_);
  CreateSignatureHash(&sighash,this,txid,vout,script,&local_3c,
                      (Amount *)CONCAT44(in_stack_00000014,sighash_type._8_4_),(WitnessVersion)value
                     );
  core::ByteData::GetBytes(&local_88,&sighash);
  core::ByteData256::ByteData256(&local_70,&local_88);
  bVar1 = core::SignatureUtil::VerifyEcSignature(&local_70,pubkey,signature);
  if (local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (sighash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(sighash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool TransactionController::VerifyInputSignature(
    const ByteData& signature, const Pubkey& pubkey, const Txid& txid,
    uint32_t vout, const Script& script, SigHashType sighash_type,
    const Amount& value, WitnessVersion version) const {
  auto sighash = this->CreateSignatureHash(
      txid, vout, script, sighash_type, value, version);
  return SignatureUtil::VerifyEcSignature(
      ByteData256(sighash.GetBytes()), pubkey, signature);
}